

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::_::ImmediatePromiseNode<bool>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<bool>,bool>(kj *this,bool *params)

{
  ImmediatePromiseNode<bool> *pIVar1;
  ImmediatePromiseNode<bool> *extraout_RDX;
  ImmediatePromiseNode<bool> *extraout_RDX_00;
  Own<kj::_::ImmediatePromiseNode<bool>_> OVar2;
  ExceptionOr<bool> local_180;
  
  pIVar1 = (ImmediatePromiseNode<bool> *)operator_new(0x170);
  local_180.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_180.value.ptr.isSet = true;
  local_180.value.ptr.field_1.value = *params;
  _::ImmediatePromiseNode<bool>::ImmediatePromiseNode(pIVar1,&local_180);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ImmediatePromiseNode<bool>>::instance;
  *(ImmediatePromiseNode<bool> **)(this + 8) = pIVar1;
  pIVar1 = extraout_RDX;
  if (local_180.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_180.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pIVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}